

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  __pid_t _Var3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  vw_exception *this;
  char *__buf;
  string sStack_348;
  stringstream __msg;
  ostream local_318 [496];
  SpanningTree spanningTree;
  
  if (2 < argc) {
    poVar4 = std::operator<<((ostream *)&std::cout,"usage: spanning_tree [--nondaemon | pid_file]");
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(0);
  }
  if (argc == 2) {
    iVar2 = strcmp("--nondaemon",argv[1]);
    if (iVar2 == 0) goto LAB_00103702;
  }
  iVar2 = daemon(1,1);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar4 = local_318;
    std::operator<<(poVar4,"daemon: ");
    piVar5 = __errno_location();
    __buf = &spanningTree.m_stop;
    pcVar6 = strerror_r(*piVar5,__buf,0x100);
    if (pcVar6 == (char *)0x0) {
      poVar4 = std::operator<<(poVar4,"errno = ");
    }
    else {
      __buf = "errno = unknown";
    }
    std::operator<<(poVar4,__buf);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/cluster/spanning_tree_main.cc"
               ,0x29,&sStack_348);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
LAB_00103702:
  VW::SpanningTree::SpanningTree(&spanningTree,0x67af);
  if (argc == 2) {
    iVar2 = strcmp("--nondaemon",argv[1]);
    if (iVar2 != 0) {
      std::ofstream::ofstream(&__msg);
      std::ofstream::open((char *)&__msg,(_Ios_Openmode)argv[1]);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cerr,"error writing pid file");
        std::endl<char,std::char_traits<char>>(poVar4);
        exit(1);
      }
      _Var3 = getpid();
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&__msg,_Var3);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::ofstream::close();
      std::ofstream::~ofstream(&__msg);
    }
  }
  VW::SpanningTree::Run(&spanningTree);
  VW::SpanningTree::~SpanningTree(&spanningTree);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{ if (argc > 2)
  { cout << "usage: spanning_tree [--nondaemon | pid_file]" << endl;
    exit(0);
  }

  try
  { if (argc == 2 && strcmp("--nondaemon",argv[1])==0)
      ;
    else if (daemon(1,1))
      THROWERRNO("daemon: ");

    SpanningTree spanningTree;

    if (argc == 2 && strcmp("--nondaemon",argv[1])!=0)
    { ofstream pid_file;
      pid_file.open(argv[1]);
      if (!pid_file.is_open())
      { cerr << "error writing pid file" << endl;
        exit(1);
      }
      pid_file << getpid() << endl;
      pid_file.close();
    }

    spanningTree.Run();
  }
  catch (VW::vw_exception& e)
  { cerr << "spanning tree (" << e.Filename() << ":" << e.LineNumber() << "): " << e.what() << endl;
  }
}